

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_> * __thiscall
wallet::DescriptorScriptPubKeyMan::MarkUnusedAddresses
          (vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>
           *__return_storage_ptr__,DescriptorScriptPubKeyMan *this,CScript *script)

{
  int32_t *piVar1;
  uint uVar2;
  element_type *peVar3;
  int iVar4;
  int iVar5;
  mapped_type_conflict *pmVar6;
  FlatSigningProvider *__s;
  _Rb_tree_header *p_Var7;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long in_FS_OFFSET;
  vector<CScript,_std::allocator<CScript>_> scripts_temp;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock60;
  CTxDestination dest;
  vector<CScript,_std::allocator<CScript>_> local_118;
  FlatSigningProvider *local_f8;
  unique_lock<std::recursive_mutex> local_f0;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_e0;
  undefined1 local_8f;
  undefined1 local_88 [72];
  __index_type local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_f0._M_device = &(this->cs_desc_man).super_recursive_mutex;
  local_f0._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_f0);
  (__return_storage_ptr__->
  super__Vector_base<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[3])(this,script);
  if (iVar4 != 0) {
    pmVar6 = std::
             map<CScript,_int,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>
             ::operator[](&this->m_map_script_pub_keys,script);
    iVar4 = *pmVar6;
    if ((this->m_wallet_descriptor).next_index <= iVar4) {
      ScriptPubKeyMan::WalletLogPrintf<char_const*,int>
                (&this->super_ScriptPubKeyMan,
                 "%s: Detected a used keypool item at index %d, mark all keypool items up to this item as used\n"
                 ,"MarkUnusedAddresses",iVar4);
      __s = (FlatSigningProvider *)operator_new(0xf8);
      memset(__s,0,0xe0);
      (__s->super_SigningProvider)._vptr_SigningProvider =
           (_func_int **)&PTR__FlatSigningProvider_006bfd40;
      p_Var7 = &(__s->scripts)._M_t._M_impl.super__Rb_tree_header;
      (__s->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var7->_M_header;
      (__s->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var7->_M_header;
      p_Var7 = &(__s->pubkeys)._M_t._M_impl.super__Rb_tree_header;
      (__s->pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var7->_M_header;
      (__s->pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var7->_M_header;
      p_Var7 = &(__s->origins)._M_t._M_impl.super__Rb_tree_header;
      (__s->origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var7->_M_header;
      (__s->origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var7->_M_header;
      p_Var7 = &(__s->keys)._M_t._M_impl.super__Rb_tree_header;
      (__s->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var7->_M_header;
      (__s->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var7->_M_header;
      p_Var7 = &(__s->tr_trees)._M_t._M_impl.super__Rb_tree_header;
      (__s->tr_trees)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var7->_M_header;
      (__s->tr_trees)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var7->_M_header;
      (__s->tr_trees)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_118.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_118.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
      super__Vector_impl_data._M_start = (CScript *)0x0;
      local_118.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar2 = (this->m_wallet_descriptor).next_index;
      local_f8 = __s;
      if ((int)uVar2 <= iVar4) {
        do {
          peVar3 = (this->m_wallet_descriptor).descriptor.
                   super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          iVar5 = (*peVar3->_vptr_Descriptor[9])
                            (peVar3,(ulong)uVar2,&(this->m_wallet_descriptor).cache,&local_118,
                             local_f8);
          if ((char)iVar5 == '\0') {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_88._0_8_ = local_88 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_88,"MarkUnusedAddresses","");
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_88,": Unable to expand descriptor from cache");
            local_e0._0_8_ = (pbVar8->_M_dataplus)._M_p;
            paVar9 = &pbVar8->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._0_8_ == paVar9) {
              local_e0._16_8_ = paVar9->_M_allocated_capacity;
              local_e0._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              local_e0._0_8_ = local_e0._M_first._M_storage._M_storage + 0x10;
            }
            else {
              local_e0._16_8_ = paVar9->_M_allocated_capacity;
            }
            local_e0._8_8_ = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
            pbVar8->_M_string_length = 0;
            (pbVar8->field_2)._M_local_buf[0] = '\0';
            std::runtime_error::runtime_error(this_00,(string *)&local_e0._M_first);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_00223d37;
          }
          local_88._16_8_ = 0;
          local_88._24_8_ = 0;
          local_88._0_8_ = (undefined1 *)0x0;
          local_88._8_8_ = 0;
          local_40 = '\0';
          ExtractDestination(local_118.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl
                             .super__Vector_impl_data._M_start,(CTxDestination *)local_88);
          std::__detail::__variant::
          _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_e0._M_first,
                            (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)local_88);
          local_8f = 0;
          std::vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>::
          emplace_back<wallet::WalletDestination>
                    (__return_storage_ptr__,(WalletDestination *)&local_e0._M_first);
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)&local_e0._M_first);
          piVar1 = &(this->m_wallet_descriptor).next_index;
          *piVar1 = *piVar1 + 1;
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)local_88);
          uVar2 = (this->m_wallet_descriptor).next_index;
        } while ((int)uVar2 <= iVar4);
      }
      std::vector<CScript,_std::allocator<CScript>_>::~vector(&local_118);
      if (local_f8 != (FlatSigningProvider *)0x0) {
        std::default_delete<FlatSigningProvider>::operator()
                  ((default_delete<FlatSigningProvider> *)&local_f8,local_f8);
      }
    }
    iVar4 = (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[9])(this,0);
    if ((char)iVar4 == '\0') {
      ScriptPubKeyMan::WalletLogPrintf<char_const*>
                (&this->super_ScriptPubKeyMan,"%s: Topping up keypool failed (locked wallet)\n",
                 "MarkUnusedAddresses");
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_f0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00223d37:
  __stack_chk_fail();
}

Assistant:

std::vector<WalletDestination> DescriptorScriptPubKeyMan::MarkUnusedAddresses(const CScript& script)
{
    LOCK(cs_desc_man);
    std::vector<WalletDestination> result;
    if (IsMine(script)) {
        int32_t index = m_map_script_pub_keys[script];
        if (index >= m_wallet_descriptor.next_index) {
            WalletLogPrintf("%s: Detected a used keypool item at index %d, mark all keypool items up to this item as used\n", __func__, index);
            auto out_keys = std::make_unique<FlatSigningProvider>();
            std::vector<CScript> scripts_temp;
            while (index >= m_wallet_descriptor.next_index) {
                if (!m_wallet_descriptor.descriptor->ExpandFromCache(m_wallet_descriptor.next_index, m_wallet_descriptor.cache, scripts_temp, *out_keys)) {
                    throw std::runtime_error(std::string(__func__) + ": Unable to expand descriptor from cache");
                }
                CTxDestination dest;
                ExtractDestination(scripts_temp[0], dest);
                result.push_back({dest, std::nullopt});
                m_wallet_descriptor.next_index++;
            }
        }
        if (!TopUp()) {
            WalletLogPrintf("%s: Topping up keypool failed (locked wallet)\n", __func__);
        }
    }

    return result;
}